

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_sub_create_info<VkPipelineLibraryCreateInfoKHR>
          (Impl *this,VkPipelineLibraryCreateInfoKHR **sub_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info,VkGraphicsPipelineLibraryFlagsEXT state_flags)

{
  bool bVar1;
  VkPipelineLibraryCreateInfoKHR *pVVar2;
  pointer local_40;
  void *pNext;
  DynamicStateInfo *pDStack_30;
  VkGraphicsPipelineLibraryFlagsEXT state_flags_local;
  DynamicStateInfo *dynamic_state_info_local;
  ScratchAllocator *alloc_local;
  VkPipelineLibraryCreateInfoKHR **sub_info_local;
  Impl *this_local;
  
  if (*sub_info != (VkPipelineLibraryCreateInfoKHR *)0x0) {
    pNext._4_4_ = state_flags;
    pDStack_30 = dynamic_state_info;
    dynamic_state_info_local = (DynamicStateInfo *)alloc;
    alloc_local = (ScratchAllocator *)sub_info;
    sub_info_local = (VkPipelineLibraryCreateInfoKHR **)this;
    pVVar2 = copy<VkPipelineLibraryCreateInfoKHR>(this,*sub_info,1,alloc);
    alloc_local->impl = (Impl *)pVVar2;
    local_40 = (pointer)0x0;
    bVar1 = copy_pnext_chain(this,(alloc_local->impl->blocks).
                                  super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                                  ._M_impl.super__Vector_impl_data._M_finish,
                             (ScratchAllocator *)dynamic_state_info_local,&local_40,pDStack_30,
                             pNext._4_4_);
    if (!bVar1) {
      return false;
    }
    (alloc_local->impl->blocks).
    super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
    ._M_impl.super__Vector_impl_data._M_finish = local_40;
  }
  return true;
}

Assistant:

bool StateRecorder::Impl::copy_sub_create_info(const SubCreateInfo *&sub_info, ScratchAllocator &alloc,
                                               const DynamicStateInfo *dynamic_state_info,
                                               VkGraphicsPipelineLibraryFlagsEXT state_flags)
{
	if (sub_info)
	{
		sub_info = copy(sub_info, 1, alloc);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(sub_info->pNext, alloc, &pNext, dynamic_state_info, state_flags))
			return false;
		const_cast<SubCreateInfo *>(sub_info)->pNext = pNext;
	}

	return true;
}